

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

void archive_entry_copy_mac_metadata(archive_entry *entry,void *p,size_t s)

{
  void *__dest;
  
  free(entry->mac_metadata);
  if (p == (void *)0x0 || s == 0) {
    entry->mac_metadata = (void *)0x0;
    entry->mac_metadata_size = 0;
    return;
  }
  entry->mac_metadata_size = s;
  __dest = malloc(s);
  entry->mac_metadata = __dest;
  if (__dest != (void *)0x0) {
    memcpy(__dest,p,s);
    return;
  }
  abort();
}

Assistant:

void
archive_entry_copy_mac_metadata(struct archive_entry *entry,
    const void *p, size_t s)
{
  free(entry->mac_metadata);
  if (p == NULL || s == 0) {
    entry->mac_metadata = NULL;
    entry->mac_metadata_size = 0;
  } else {
    entry->mac_metadata_size = s;
    entry->mac_metadata = malloc(s);
    if (entry->mac_metadata == NULL)
      abort();
    memcpy(entry->mac_metadata, p, s);
  }
}